

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-bind-error.c
# Opt level: O2

int run_test_pipe_bind_error_addrnotavail(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_a;
  uv_pipe_t server;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_pipe_init(uVar2,&server,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_pipe_bind(&server,"/path/to/unix/socket/that/really/should/not/be/there");
    eval_a = (int64_t)iVar1;
    eval_b = -0xd;
    if (eval_a == -0xd) {
      uv_close(&server,close_cb);
      uVar2 = uv_default_loop();
      uv_run(uVar2,0);
      eval_a = 1;
      eval_b = (int64_t)close_cb_called;
      if (eval_b == 1) {
        loop = (uv_loop_t *)uv_default_loop();
        close_loop(loop);
        eval_a = 0;
        uVar2 = uv_default_loop();
        iVar1 = uv_loop_close(uVar2);
        eval_b = (int64_t)iVar1;
        if (eval_b == 0) {
          uv_library_shutdown();
          return 0;
        }
        pcVar4 = "uv_loop_close(uv_default_loop())";
        pcVar3 = "0";
        uVar2 = 0x5d;
      }
      else {
        pcVar4 = "close_cb_called";
        pcVar3 = "1";
        uVar2 = 0x5b;
      }
    }
    else {
      pcVar4 = "UV_EACCES";
      pcVar3 = "r";
      uVar2 = 0x55;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x52;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-bind-error.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_bind_error_addrnotavail) {
  uv_pipe_t server;
  int r;

  r = uv_pipe_init(uv_default_loop(), &server, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server, BAD_PIPENAME);
  ASSERT_EQ(r, UV_EACCES);

  uv_close((uv_handle_t*)&server, close_cb);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT_EQ(1, close_cb_called);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}